

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

size_t coins_tests::InsertCoinsMapEntry
                 (CCoinsMap *map,CoinsCachePair *sentinel,CAmount value,char flags)

{
  _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> _Var1;
  size_t sVar2;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar3;
  CCoinsCacheEntry entry;
  CCoinsCacheEntry local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (value == -2) {
    if (flags != -1) {
      __assert_fail("flags == NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x253,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    sVar2 = 0;
  }
  else {
    if (flags == -1) {
      __assert_fail("flags != NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x256,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    CCoinsCacheEntry::CCoinsCacheEntry(&local_70);
    Coin::Clear(&local_70.coin);
    if (local_70.coin.out.nValue != -1) {
      __assert_fail("coin.IsSpent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x248,"void coins_tests::SetCoinsValue(CAmount, Coin &)");
    }
    if (value != -1) {
      local_70.coin._40_4_ = local_70.coin._40_4_ & 1 | 2;
      local_70.coin.out.nValue = value;
    }
    pVar3 = std::
            _Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<COutPoint_const&,CCoinsCacheEntry>
                      ((_Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)map,OUTPOINT,&local_70);
    _Var1 = pVar3.first.
            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x25a,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    CCoinsCacheEntry::AddFlags
              ((CCoinsCacheEntry *)
               ((long)_Var1.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 0x30),flags,
               (CoinsCachePair *)
               ((long)_Var1.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 8),sentinel);
    sVar2 = Coin::DynamicMemoryUsage
                      ((Coin *)((long)_Var1.
                                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                      ._M_cur + 0x48));
    CCoinsCacheEntry::~CCoinsCacheEntry(&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

static size_t InsertCoinsMapEntry(CCoinsMap& map, CoinsCachePair& sentinel, CAmount value, char flags)
{
    if (value == ABSENT) {
        assert(flags == NO_ENTRY);
        return 0;
    }
    assert(flags != NO_ENTRY);
    CCoinsCacheEntry entry;
    SetCoinsValue(value, entry.coin);
    auto inserted = map.emplace(OUTPOINT, std::move(entry));
    assert(inserted.second);
    inserted.first->second.AddFlags(flags, *inserted.first, sentinel);
    return inserted.first->second.coin.DynamicMemoryUsage();
}